

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_int32 *
drwav_open_and_read_s32
          (drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData,uint *channels,
          uint *sampleRate,drwav_uint64 *totalSampleCount)

{
  drwav_bool32 dVar1;
  undefined1 local_190 [8];
  drwav wav;
  drwav_uint64 *totalSampleCount_local;
  uint *sampleRate_local;
  uint *channels_local;
  void *pUserData_local;
  drwav_seek_proc onSeek_local;
  drwav_read_proc onRead_local;
  
  if (sampleRate != (uint *)0x0) {
    *sampleRate = 0;
  }
  if (channels != (uint *)0x0) {
    *channels = 0;
  }
  if (totalSampleCount != (drwav_uint64 *)0x0) {
    *totalSampleCount = 0;
  }
  wav._328_8_ = totalSampleCount;
  dVar1 = drwav_init((drwav *)local_190,onRead,onSeek,pUserData);
  if (dVar1 == 0) {
    onRead_local = (drwav_read_proc)0x0;
  }
  else {
    onRead_local = (drwav_read_proc)
                   drwav__read_and_close_s32
                             ((drwav *)local_190,channels,sampleRate,(drwav_uint64 *)wav._328_8_);
  }
  return (drwav_int32 *)onRead_local;
}

Assistant:

drwav_int32* drwav_open_and_read_s32(drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData,
                                     unsigned int* channels, unsigned int* sampleRate, drwav_uint64* totalSampleCount) {
    if (sampleRate) *sampleRate = 0;
    if (channels) *channels = 0;
    if (totalSampleCount) *totalSampleCount = 0;

    drwav wav;
    if (!drwav_init(&wav, onRead, onSeek, pUserData)) {
        return NULL;
    }

    return drwav__read_and_close_s32(&wav, channels, sampleRate, totalSampleCount);
}